

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O1

int PAL_atexit(_func_void *function)

{
  int iVar1;
  
  if (PAL_InitializeChakraCoreCalled) {
    iVar1 = atexit((__func *)function);
    if (PAL_InitializeChakraCoreCalled != false) {
      return iVar1;
    }
  }
  abort();
}

Assistant:

int
PAL_atexit(void (__cdecl *function)(void))
{
    int ret;
    
    PERF_ENTRY(atexit);
    ENTRY ("atexit(function=%p)\n", function);
    ret = atexit(function);
    LOGEXIT ("atexit returns int %d", ret);
    PERF_EXIT(atexit);
    return ret;
}